

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SqueezeLayerParams::MergeFrom
          (SqueezeLayerParams *this,SqueezeLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xfbe3);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->axes_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->axes_,iVar1 + (this->axes_).current_size_)
    ;
    memcpy(((this->axes_).rep_)->elements + (this->axes_).current_size_,
           ((from->axes_).rep_)->elements,(long)(from->axes_).current_size_ << 3);
    (this->axes_).current_size_ = (this->axes_).current_size_ + (from->axes_).current_size_;
  }
  if (from->squeezeall_ == true) {
    this->squeezeall_ = true;
  }
  return;
}

Assistant:

void SqueezeLayerParams::MergeFrom(const SqueezeLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SqueezeLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  axes_.MergeFrom(from.axes_);
  if (from.squeezeall() != 0) {
    set_squeezeall(from.squeezeall());
  }
}